

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_l10n.c
# Opt level: O0

void add_suite_l10n(CuSuite *suite)

{
  CuTest *pCVar1;
  CuSuite *suite_local;
  
  pCVar1 = CuTestNew("test_l10n",test_l10n);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_l10n_const",test_l10n_const);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_l10n_simple",test_l10n_simple);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_l10n_nested",test_l10n_nested);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_l10n_build",test_l10n_build);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_l10n_heap",test_l10n_heap);
  CuSuiteAdd(suite,pCVar1);
  return;
}

Assistant:

void add_suite_l10n(CuSuite *suite)
{
    SUITE_ADD_TEST(suite, test_l10n);
    SUITE_ADD_TEST(suite, test_l10n_const);
    SUITE_ADD_TEST(suite, test_l10n_simple);
    SUITE_ADD_TEST(suite, test_l10n_nested);
    SUITE_ADD_TEST(suite, test_l10n_build);
    SUITE_ADD_TEST(suite, test_l10n_heap);
}